

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O3

void iutest::detail::PrintToFloatingPoint<long_double>
               (floating_point<long_double> *f,iu_ostream *os)

{
  ulong uVar1;
  ulong uVar2;
  char cVar3;
  char cVar11;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  uint uVar43;
  ostream *poVar44;
  long lVar45;
  size_t sVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  uint uVar50;
  uint uVar51;
  uint uVar52;
  uint uVar53;
  uint uVar54;
  uint uVar55;
  uint uVar56;
  uint uVar57;
  uint uVar58;
  uint uVar59;
  uint uVar60;
  uint uVar61;
  short sVar62;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  long lVar75;
  long lVar76;
  long lVar77;
  long lVar78;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  short sVar81;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  long lVar90;
  long lVar91;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  iu_stringstream ss;
  long *local_2f8;
  long local_2f0;
  long local_2e8 [2];
  long *local_2d8;
  long local_2d0;
  long local_2c8 [2];
  long local_2b8;
  long lStack_2b0;
  long local_2a8;
  long lStack_2a0;
  long local_298;
  long lStack_290;
  long local_288;
  long lStack_280;
  long local_278;
  long lStack_270;
  ulong local_268;
  ulong uStack_260;
  ulong local_258;
  ulong uStack_250;
  ulong local_248;
  ulong uStack_240;
  ulong local_238;
  ulong uStack_230;
  ulong local_228;
  ulong uStack_220;
  ulong local_218;
  ulong uStack_210;
  ulong local_208;
  ulong uStack_200;
  ulong local_1f8;
  ulong uStack_1f0;
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8;
  stringstream local_1b8 [16];
  long local_1a8;
  undefined8 local_1a0 [13];
  ios_base local_138 [264];
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  undefined4 uVar63;
  undefined6 uVar64;
  undefined8 uVar65;
  undefined1 auVar66 [12];
  undefined1 auVar67 [14];
  undefined4 uVar82;
  undefined6 uVar83;
  undefined8 uVar84;
  undefined1 auVar85 [12];
  undefined1 auVar86 [14];
  undefined1 auVar89 [16];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  *(undefined8 *)((long)local_1a0 + *(long *)(local_1a8 + -0x18)) = 0x14;
  std::ostream::_M_insert<long_double>(*(longdouble *)&f->m_v);
  std::__cxx11::stringbuf::str();
  poVar44 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_2d8,local_2d0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar44,"(0x",3);
  uVar1 = *(ulong *)&f->m_v;
  uVar2 = *(ulong *)((long)&f->m_v + 8);
  local_1d8 = (undefined1  [16])0x0;
  local_1e8 = (undefined1  [16])0x0;
  lVar90 = 4;
  lVar91 = 5;
  lVar75 = 2;
  lVar76 = 3;
  lVar77 = 0;
  lVar78 = 1;
  lVar45 = 0;
  lVar33 = 0xc;
  lVar34 = 0xd;
  lVar35 = 6;
  lVar36 = 7;
  lVar37 = 10;
  lVar38 = 0xb;
  lVar39 = 8;
  lVar40 = 9;
  lVar41 = 0xe;
  lVar42 = 0xf;
  do {
    lStack_270 = lVar42;
    local_278 = lVar41;
    lStack_2a0 = lVar40;
    local_2a8 = lVar39;
    lStack_290 = lVar38;
    local_298 = lVar37;
    lStack_2b0 = lVar36;
    local_2b8 = lVar35;
    lStack_280 = lVar34;
    local_288 = lVar33;
    local_248 = lVar90 * -4 + 0x7c;
    uStack_240 = lVar91 * -4 + 0x7c;
    local_238 = local_2b8 * -4 + 0x7c;
    uStack_230 = lStack_2b0 * -4 + 0x7c;
    local_268 = lVar77 * -4 + 0x7c;
    uStack_260 = lVar78 * -4 + 0x7c;
    local_258 = lVar75 * -4 + 0x7c;
    uStack_250 = lVar76 * -4 + 0x7c;
    local_208 = local_288 * -4 + 0x7c;
    uStack_200 = lStack_280 * -4 + 0x7c;
    local_1f8 = local_278 * -4 + 0x7c;
    uStack_1f0 = lStack_270 * -4 + 0x7c;
    local_228 = local_2a8 * -4 + 0x7c;
    uStack_220 = lStack_2a0 * -4 + 0x7c;
    local_218 = local_298 * -4 + 0x7c;
    uStack_210 = lStack_290 * -4 + 0x7c;
    uVar47 = (uint)(uVar2 >> ((byte)uStack_210 & 0x3f));
    if ((uStack_210 & 0x40) == 0) {
      uVar47 = (uint)(uVar1 >> ((byte)uStack_210 & 0x3f)) |
               (uint)(uVar2 << 0x40 - ((byte)uStack_210 & 0x3f));
    }
    uVar48 = (uint)(uVar2 >> ((byte)local_218 & 0x3f));
    if ((local_218 & 0x40) == 0) {
      uVar48 = (uint)(uVar1 >> ((byte)local_218 & 0x3f)) |
               (uint)(uVar2 << 0x40 - ((byte)local_218 & 0x3f));
    }
    uVar49 = (uint)(uVar2 >> ((byte)uStack_220 & 0x3f));
    if ((uStack_220 & 0x40) == 0) {
      uVar49 = (uint)(uVar1 >> ((byte)uStack_220 & 0x3f)) |
               (uint)(uVar2 << 0x40 - ((byte)uStack_220 & 0x3f));
    }
    uVar50 = (uint)(uVar2 >> ((byte)local_228 & 0x3f));
    if ((local_228 & 0x40) == 0) {
      uVar50 = (uint)(uVar1 >> ((byte)local_228 & 0x3f)) |
               (uint)(uVar2 << 0x40 - ((byte)local_228 & 0x3f));
    }
    uVar60 = (uint)(uVar2 >> ((byte)uStack_1f0 & 0x3f));
    if ((uStack_1f0 & 0x40) == 0) {
      uVar60 = (uint)(uVar1 >> ((byte)uStack_1f0 & 0x3f)) |
               (uint)(uVar2 << 0x40 - ((byte)uStack_1f0 & 0x3f));
    }
    uVar61 = (uint)(uVar2 >> ((byte)local_1f8 & 0x3f));
    if ((local_1f8 & 0x40) == 0) {
      uVar61 = (uint)(uVar1 >> ((byte)local_1f8 & 0x3f)) |
               (uint)(uVar2 << 0x40 - ((byte)local_1f8 & 0x3f));
    }
    uVar58 = (uint)(uVar2 >> ((byte)uStack_200 & 0x3f));
    if ((uStack_200 & 0x40) == 0) {
      uVar58 = (uint)(uVar1 >> ((byte)uStack_200 & 0x3f)) |
               (uint)(uVar2 << 0x40 - ((byte)uStack_200 & 0x3f));
    }
    uVar59 = (uint)(uVar2 >> ((byte)local_208 & 0x3f));
    if ((local_208 & 0x40) == 0) {
      uVar59 = (uint)(uVar1 >> ((byte)local_208 & 0x3f)) |
               (uint)(uVar2 << 0x40 - ((byte)local_208 & 0x3f));
    }
    uVar53 = (uint)(uVar2 >> ((byte)uStack_250 & 0x3f));
    if ((uStack_250 & 0x40) == 0) {
      uVar53 = (uint)(uVar1 >> ((byte)uStack_250 & 0x3f)) |
               (uint)(uVar2 << 0x40 - ((byte)uStack_250 & 0x3f));
    }
    uVar56 = (uint)(uVar2 >> ((byte)local_258 & 0x3f));
    if ((local_258 & 0x40) == 0) {
      uVar56 = (uint)(uVar1 >> ((byte)local_258 & 0x3f)) |
               (uint)(uVar2 << 0x40 - ((byte)local_258 & 0x3f));
    }
    uVar52 = (uint)(uVar2 >> ((byte)local_268 & 0x3f));
    if ((local_268 & 0x40) == 0) {
      uVar52 = (uint)(uVar1 >> ((byte)local_268 & 0x3f)) |
               (uint)(uVar2 << 0x40 - ((byte)local_268 & 0x3f));
    }
    uVar57 = (uint)(uVar2 >> ((byte)uStack_260 & 0x3f));
    if ((uStack_260 & 0x40) == 0) {
      uVar57 = (uint)(uVar1 >> ((byte)uStack_260 & 0x3f)) |
               (uint)(uVar2 << 0x40 - ((byte)uStack_260 & 0x3f));
    }
    uVar51 = (uint)(uVar2 >> ((byte)uStack_230 & 0x3f));
    if ((uStack_230 & 0x40) == 0) {
      uVar51 = (uint)(uVar1 >> ((byte)uStack_230 & 0x3f)) |
               (uint)(uVar2 << 0x40 - ((byte)uStack_230 & 0x3f));
    }
    uVar54 = (uint)(uVar2 >> ((byte)local_238 & 0x3f));
    if ((local_238 & 0x40) == 0) {
      uVar54 = (uint)(uVar1 >> ((byte)local_238 & 0x3f)) |
               (uint)(uVar2 << 0x40 - ((byte)local_238 & 0x3f));
    }
    uVar43 = (uint)(uVar2 >> ((byte)uStack_240 & 0x3f));
    if ((uStack_240 & 0x40) == 0) {
      uVar43 = (uint)(uVar1 >> ((byte)uStack_240 & 0x3f)) |
               (uint)(uVar2 << 0x40 - ((byte)uStack_240 & 0x3f));
    }
    uVar55 = (uint)(uVar2 >> ((byte)local_248 & 0x3f));
    if ((local_248 & 0x40) == 0) {
      uVar55 = (uint)(uVar1 >> ((byte)local_248 & 0x3f)) |
               (uint)(uVar2 << 0x40 - ((byte)local_248 & 0x3f));
    }
    auVar79._4_4_ = uVar58;
    auVar79._0_4_ = uVar59;
    auVar93._12_4_ = uVar53;
    auVar93._8_4_ = uVar56;
    auVar79._12_4_ = uVar60;
    auVar79._8_4_ = uVar61;
    auVar93._4_4_ = uVar57;
    auVar93._0_4_ = uVar52;
    auVar80._4_4_ = uVar49;
    auVar80._0_4_ = uVar50;
    auVar92._12_4_ = uVar51;
    auVar92._8_4_ = uVar54;
    auVar80._12_4_ = uVar47;
    auVar80._8_4_ = uVar48;
    auVar92._4_4_ = uVar43;
    auVar92._0_4_ = uVar55;
    auVar80 = auVar80 & _DAT_0016a050;
    auVar87._0_4_ = -(uint)(9 < auVar80._0_4_);
    auVar87._4_4_ = -(uint)(9 < auVar80._4_4_);
    auVar87._8_4_ = -(uint)(9 < auVar80._8_4_);
    auVar87._12_4_ = -(uint)(9 < auVar80._12_4_);
    auVar70._0_4_ = auVar80._0_4_ + 0x37;
    auVar70._4_4_ = auVar80._4_4_ + 0x37;
    auVar70._8_4_ = auVar80._8_4_ + 0x37;
    auVar70._12_4_ = auVar80._12_4_ + 0x37;
    auVar79 = auVar79 & _DAT_0016a050;
    auVar69._0_4_ = -(uint)(9 < auVar79._0_4_);
    auVar69._4_4_ = -(uint)(9 < auVar79._4_4_);
    auVar69._8_4_ = -(uint)(9 < auVar79._8_4_);
    auVar69._12_4_ = -(uint)(9 < auVar79._12_4_);
    auVar88 = ~auVar87 & (auVar80 | _DAT_0016a080) | auVar70 & auVar87;
    auVar74._0_4_ = auVar79._0_4_ + 0x37;
    auVar74._4_4_ = auVar79._4_4_ + 0x37;
    auVar74._8_4_ = auVar79._8_4_ + 0x37;
    auVar74._12_4_ = auVar79._12_4_ + 0x37;
    auVar93 = auVar93 & _DAT_0016a050;
    auVar92 = auVar92 & _DAT_0016a050;
    auVar70 = ~auVar69 & (auVar79 | _DAT_0016a080) | auVar74 & auVar69;
    auVar68._0_4_ = -(uint)(9 < auVar93._0_4_);
    auVar68._4_4_ = -(uint)(9 < auVar93._4_4_);
    auVar68._8_4_ = -(uint)(9 < auVar93._8_4_);
    auVar68._12_4_ = -(uint)(9 < auVar93._12_4_);
    sVar19 = auVar88._0_2_;
    cVar3 = (0 < sVar19) * (sVar19 < 0x100) * auVar88[0] - (0xff < sVar19);
    sVar19 = auVar88._2_2_;
    sVar81 = CONCAT11((0 < sVar19) * (sVar19 < 0x100) * auVar88[2] - (0xff < sVar19),cVar3);
    sVar19 = auVar88._4_2_;
    cVar4 = (0 < sVar19) * (sVar19 < 0x100) * auVar88[4] - (0xff < sVar19);
    sVar19 = auVar88._6_2_;
    uVar82 = CONCAT13((0 < sVar19) * (sVar19 < 0x100) * auVar88[6] - (0xff < sVar19),
                      CONCAT12(cVar4,sVar81));
    sVar19 = auVar88._8_2_;
    cVar5 = (0 < sVar19) * (sVar19 < 0x100) * auVar88[8] - (0xff < sVar19);
    sVar19 = auVar88._10_2_;
    uVar83 = CONCAT15((0 < sVar19) * (sVar19 < 0x100) * auVar88[10] - (0xff < sVar19),
                      CONCAT14(cVar5,uVar82));
    sVar19 = auVar88._12_2_;
    cVar6 = (0 < sVar19) * (sVar19 < 0x100) * auVar88[0xc] - (0xff < sVar19);
    sVar19 = auVar88._14_2_;
    uVar84 = CONCAT17((0 < sVar19) * (sVar19 < 0x100) * auVar88[0xe] - (0xff < sVar19),
                      CONCAT16(cVar6,uVar83));
    sVar19 = auVar70._0_2_;
    cVar7 = (0 < sVar19) * (sVar19 < 0x100) * auVar70[0] - (0xff < sVar19);
    sVar19 = auVar70._2_2_;
    auVar85._0_10_ =
         CONCAT19((0 < sVar19) * (sVar19 < 0x100) * auVar70[2] - (0xff < sVar19),
                  CONCAT18(cVar7,uVar84));
    sVar19 = auVar70._4_2_;
    cVar8 = (0 < sVar19) * (sVar19 < 0x100) * auVar70[4] - (0xff < sVar19);
    auVar85[10] = cVar8;
    sVar19 = auVar70._6_2_;
    auVar85[0xb] = (0 < sVar19) * (sVar19 < 0x100) * auVar70[6] - (0xff < sVar19);
    sVar19 = auVar70._8_2_;
    cVar9 = (0 < sVar19) * (sVar19 < 0x100) * auVar70[8] - (0xff < sVar19);
    auVar86[0xc] = cVar9;
    auVar86._0_12_ = auVar85;
    sVar19 = auVar70._10_2_;
    auVar86[0xd] = (0 < sVar19) * (sVar19 < 0x100) * auVar70[10] - (0xff < sVar19);
    sVar19 = auVar70._12_2_;
    cVar10 = (0 < sVar19) * (sVar19 < 0x100) * auVar70[0xc] - (0xff < sVar19);
    auVar89[0xe] = cVar10;
    auVar89._0_14_ = auVar86;
    sVar19 = auVar70._14_2_;
    auVar89[0xf] = (0 < sVar19) * (sVar19 < 0x100) * auVar70[0xe] - (0xff < sVar19);
    auVar71._0_4_ = auVar93._0_4_ + 0x37;
    auVar71._4_4_ = auVar93._4_4_ + 0x37;
    auVar71._8_4_ = auVar93._8_4_ + 0x37;
    auVar71._12_4_ = auVar93._12_4_ + 0x37;
    auVar73._0_4_ = -(uint)(9 < auVar92._0_4_);
    auVar73._4_4_ = -(uint)(9 < auVar92._4_4_);
    auVar73._8_4_ = -(uint)(9 < auVar92._8_4_);
    auVar73._12_4_ = -(uint)(9 < auVar92._12_4_);
    auVar70 = ~auVar68 & (auVar93 | _DAT_0016a080) | auVar71 & auVar68;
    auVar72._0_4_ = auVar92._0_4_ + 0x37;
    auVar72._4_4_ = auVar92._4_4_ + 0x37;
    auVar72._8_4_ = auVar92._8_4_ + 0x37;
    auVar72._12_4_ = auVar92._12_4_ + 0x37;
    auVar74 = ~auVar73 & (auVar92 | _DAT_0016a080) | auVar72 & auVar73;
    sVar19 = auVar70._0_2_;
    cVar11 = (0 < sVar19) * (sVar19 < 0x100) * auVar70[0] - (0xff < sVar19);
    sVar19 = auVar70._2_2_;
    sVar62 = CONCAT11((0 < sVar19) * (sVar19 < 0x100) * auVar70[2] - (0xff < sVar19),cVar11);
    sVar19 = auVar70._4_2_;
    cVar12 = (0 < sVar19) * (sVar19 < 0x100) * auVar70[4] - (0xff < sVar19);
    sVar19 = auVar70._6_2_;
    uVar63 = CONCAT13((0 < sVar19) * (sVar19 < 0x100) * auVar70[6] - (0xff < sVar19),
                      CONCAT12(cVar12,sVar62));
    sVar19 = auVar70._8_2_;
    cVar13 = (0 < sVar19) * (sVar19 < 0x100) * auVar70[8] - (0xff < sVar19);
    sVar19 = auVar70._10_2_;
    uVar64 = CONCAT15((0 < sVar19) * (sVar19 < 0x100) * auVar70[10] - (0xff < sVar19),
                      CONCAT14(cVar13,uVar63));
    sVar19 = auVar70._12_2_;
    cVar14 = (0 < sVar19) * (sVar19 < 0x100) * auVar70[0xc] - (0xff < sVar19);
    sVar19 = auVar70._14_2_;
    uVar65 = CONCAT17((0 < sVar19) * (sVar19 < 0x100) * auVar70[0xe] - (0xff < sVar19),
                      CONCAT16(cVar14,uVar64));
    sVar19 = auVar74._0_2_;
    cVar15 = (0 < sVar19) * (sVar19 < 0x100) * auVar74[0] - (0xff < sVar19);
    sVar19 = auVar74._2_2_;
    auVar66._0_10_ =
         CONCAT19((0 < sVar19) * (sVar19 < 0x100) * auVar74[2] - (0xff < sVar19),
                  CONCAT18(cVar15,uVar65));
    sVar19 = auVar74._4_2_;
    cVar16 = (0 < sVar19) * (sVar19 < 0x100) * auVar74[4] - (0xff < sVar19);
    auVar66[10] = cVar16;
    sVar19 = auVar74._6_2_;
    auVar66[0xb] = (0 < sVar19) * (sVar19 < 0x100) * auVar74[6] - (0xff < sVar19);
    sVar19 = auVar74._8_2_;
    cVar17 = (0 < sVar19) * (sVar19 < 0x100) * auVar74[8] - (0xff < sVar19);
    auVar67[0xc] = cVar17;
    auVar67._0_12_ = auVar66;
    sVar19 = auVar74._10_2_;
    auVar67[0xd] = (0 < sVar19) * (sVar19 < 0x100) * auVar74[10] - (0xff < sVar19);
    sVar19 = auVar74._12_2_;
    cVar18 = (0 < sVar19) * (sVar19 < 0x100) * auVar74[0xc] - (0xff < sVar19);
    auVar88[0xe] = cVar18;
    auVar88._0_14_ = auVar67;
    sVar19 = auVar74._14_2_;
    auVar88[0xf] = (0 < sVar19) * (sVar19 < 0x100) * auVar74[0xe] - (0xff < sVar19);
    sVar19 = (short)((uint)uVar63 >> 0x10);
    sVar20 = (short)((uint6)uVar64 >> 0x20);
    sVar21 = (short)((ulong)uVar65 >> 0x30);
    sVar22 = (short)((unkuint10)auVar66._0_10_ >> 0x40);
    sVar23 = auVar66._10_2_;
    sVar24 = auVar67._12_2_;
    sVar25 = auVar88._14_2_;
    sVar26 = (short)((uint)uVar82 >> 0x10);
    sVar27 = (short)((uint6)uVar83 >> 0x20);
    sVar28 = (short)((ulong)uVar84 >> 0x30);
    sVar29 = (short)((unkuint10)auVar85._0_10_ >> 0x40);
    sVar30 = auVar85._10_2_;
    sVar31 = auVar86._12_2_;
    sVar32 = auVar89._14_2_;
    local_1e8[lVar45] = (0 < sVar62) * (sVar62 < 0x100) * cVar11 - (0xff < sVar62);
    local_1e8[lVar45 + 1] = (0 < sVar19) * (sVar19 < 0x100) * cVar12 - (0xff < sVar19);
    local_1e8[lVar45 + 2] = (0 < sVar20) * (sVar20 < 0x100) * cVar13 - (0xff < sVar20);
    local_1e8[lVar45 + 3] = (0 < sVar21) * (sVar21 < 0x100) * cVar14 - (0xff < sVar21);
    local_1e8[lVar45 + 4] = (0 < sVar22) * (sVar22 < 0x100) * cVar15 - (0xff < sVar22);
    local_1e8[lVar45 + 5] = (0 < sVar23) * (sVar23 < 0x100) * cVar16 - (0xff < sVar23);
    local_1e8[lVar45 + 6] = (0 < sVar24) * (sVar24 < 0x100) * cVar17 - (0xff < sVar24);
    local_1e8[lVar45 + 7] = (0 < sVar25) * (sVar25 < 0x100) * cVar18 - (0xff < sVar25);
    local_1e8[lVar45 + 8] = (0 < sVar81) * (sVar81 < 0x100) * cVar3 - (0xff < sVar81);
    local_1e8[lVar45 + 9] = (0 < sVar26) * (sVar26 < 0x100) * cVar4 - (0xff < sVar26);
    local_1e8[lVar45 + 10] = (0 < sVar27) * (sVar27 < 0x100) * cVar5 - (0xff < sVar27);
    local_1e8[lVar45 + 0xb] = (0 < sVar28) * (sVar28 < 0x100) * cVar6 - (0xff < sVar28);
    local_1e8[lVar45 + 0xc] = (0 < sVar29) * (sVar29 < 0x100) * cVar7 - (0xff < sVar29);
    local_1e8[lVar45 + 0xd] = (0 < sVar30) * (sVar30 < 0x100) * cVar8 - (0xff < sVar30);
    local_1e8[lVar45 + 0xe] = (0 < sVar31) * (sVar31 < 0x100) * cVar9 - (0xff < sVar31);
    local_1e8[lVar45 + 0xf] = (0 < sVar32) * (sVar32 < 0x100) * cVar10 - (0xff < sVar32);
    lVar77 = lVar77 + 0x10;
    lVar78 = lVar78 + 0x10;
    lVar75 = lVar75 + 0x10;
    lVar76 = lVar76 + 0x10;
    lVar90 = lVar90 + 0x10;
    lVar91 = lVar91 + 0x10;
    lVar45 = lVar45 + 0x10;
    lVar33 = local_288 + 0x10;
    lVar34 = lStack_280 + 0x10;
    lVar35 = local_2b8 + 0x10;
    lVar36 = lStack_2b0 + 0x10;
    lVar37 = local_298 + 0x10;
    lVar38 = lStack_290 + 0x10;
    lVar39 = local_2a8 + 0x10;
    lVar40 = lStack_2a0 + 0x10;
    lVar41 = local_278 + 0x10;
    lVar42 = lStack_270 + 0x10;
  } while (lVar45 != 0x20);
  local_1c8 = 0;
  local_2f8 = local_2e8;
  sVar46 = strlen(local_1e8);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,local_1e8,local_1e8 + sVar46)
  ;
  poVar44 = std::__ostream_insert<char,std::char_traits<char>>(poVar44,(char *)local_2f8,local_2f0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar44,")",1);
  if (local_2f8 != local_2e8) {
    operator_delete(local_2f8,local_2e8[0] + 1);
  }
  if (local_2d8 != local_2c8) {
    operator_delete(local_2d8,local_2c8[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

inline void PrintToFloatingPoint(const floating_point<T>& f, iu_ostream* os)
{
    iu_stringstream ss;
#if IUTEST_HAS_IOMANIP
    ss << ::std::setprecision(::std::numeric_limits<T>::digits10 + 2);
#endif
    UniversalPrint(f.raw(), &ss);
    *os << ss.str() << "(0x" << ToHexString(f.bits()) << ")";
}